

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_4c.h
# Opt level: O2

void __thiscall
SAUF4C<UFPC>::PerformLabelingMem
          (SAUF4C<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  Mat1b *pMVar5;
  pointer puVar6;
  pointer piVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  int r;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  void *__child_stack;
  long lVar13;
  void *in_R8;
  ulong uVar14;
  ulong uVar15;
  int c;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  allocator_type local_299;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_298;
  MemMat<int> img_labels;
  value_type_conflict3 local_1c8;
  Size local_1c0;
  Mat_<int> local_1b8;
  MemMat<unsigned_char> img;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
  uVar9 = *(uint *)&pMVar5->field_0x8;
  uVar3 = *(uint *)&pMVar5->field_0xc;
  UFPC::MemAlloc(((int)(uVar9 + 1) / 2) * ((int)(uVar3 + 1) / 2) + 1);
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  local_298 = accesses;
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_)->field_0x40;
  local_1c0.height = (int)uVar2;
  local_1c0.width = (int)((ulong)uVar2 >> 0x20);
  uVar17 = 0;
  MemMat<int>::MemMat(&img_labels,&local_1c0,0);
  UFPC::MemSetup();
  uVar15 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar15 = uVar17;
  }
  uVar14 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar14 = uVar17;
  }
  lVar13 = -1;
  do {
    if (uVar17 == uVar14) {
      uVar9 = UFPC::MemFlatten();
      (this->super_Labeling2D<(Connectivity2D)4,_false>).n_labels_ = uVar9;
      for (uVar17 = 0;
          piVar7 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          puVar6 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start, lVar13 = img_labels.accesses_._16_8_,
          lVar12 = img_labels.img_._16_8_, uVar16 = uVar15, uVar17 != uVar14; uVar17 = uVar17 + 1) {
        while (uVar16 != 0) {
          lVar10 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar13 + lVar10 * uVar17);
          *piVar1 = *piVar1 + 1;
          lVar11 = *(long *)img_labels.img_._72_8_;
          iVar4 = *(int *)(lVar12 + lVar11 * uVar17);
          piVar7[iVar4] = piVar7[iVar4] + 1;
          uVar9 = puVar6[iVar4];
          piVar1 = (int *)(lVar13 + lVar10 * uVar17);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar12 + lVar11 * uVar17) = uVar9;
          lVar13 = lVar13 + 4;
          lVar12 = lVar12 + 4;
          uVar16 = uVar16 - 1;
        }
        in_R8 = (void *)img_labels.img_._72_8_;
      }
      local_1c8 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8,4,&local_1c8,
                 &local_299);
      pvVar8 = local_298;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (local_298,&local_1b8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8);
      dVar18 = MemMat<unsigned_char>::GetTotalAccesses(&img);
      *(pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start =
           (long)(dVar18 - 9.223372036854776e+18) & (long)dVar18 >> 0x3f | (long)dVar18;
      dVar18 = MemMat<int>::GetTotalAccesses(&img_labels);
      (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[1] =
           (long)dVar18 >> 0x3f & (long)(dVar18 - 9.223372036854776e+18) | (long)dVar18;
      dVar18 = UFPC::MemTotalAccesses();
      __child_stack =
           (void *)((long)dVar18 >> 0x3f & (long)(dVar18 - 9.223372036854776e+18) | (long)dVar18);
      (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
      cv::Mat_<int>::clone
                (&local_1b8,(__fn *)&img_labels.img_,__child_stack,
                 (int)(long)(dVar18 - 9.223372036854776e+18),in_R8);
      cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->
                          super_Mat,&local_1b8.super_Mat);
      cv::Mat::~Mat(&local_1b8.super_Mat);
      MemMat<int>::~MemMat(&img_labels);
      MemMat<unsigned_char>::~MemMat(&img);
      return;
    }
    for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      lVar12 = *(long *)img.accesses_._72_8_;
      lVar10 = uVar17 * lVar12 + img.accesses_._16_8_;
      piVar1 = (int *)(lVar10 + uVar16 * 4);
      *piVar1 = *piVar1 + 1;
      in_R8 = *(void **)img.img_._72_8_;
      lVar11 = uVar17 * (long)in_R8 + img.img_._16_8_;
      if (*(char *)(uVar16 + lVar11) != '\0') {
        if (uVar17 == 0) {
LAB_001e5d90:
          if ((uVar16 == 0) ||
             (piVar1 = (int *)(lVar10 + -4 + uVar16 * 4), *piVar1 = *piVar1 + 1,
             *(char *)((uVar16 - 1) + lVar11) == '\0')) {
            uVar9 = UFPC::MemNewLabel();
LAB_001e5de2:
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar17 +
                             img_labels.accesses_._16_8_ + uVar16 * 4);
            *piVar1 = *piVar1 + 1;
            lVar12 = *(long *)img_labels.img_._72_8_ * uVar17 + img_labels.img_._16_8_;
          }
          else {
            lVar10 = *(long *)img_labels.accesses_._72_8_ * uVar17 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar10 + -4 + uVar16 * 4);
            *piVar1 = *piVar1 + 1;
            lVar12 = *(long *)img_labels.img_._72_8_ * uVar17 + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar12 + -4 + uVar16 * 4);
            piVar1 = (int *)(lVar10 + uVar16 * 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        else {
          piVar1 = (int *)(img.accesses_._16_8_ + lVar12 * lVar13 + uVar16 * 4);
          *piVar1 = *piVar1 + 1;
          in_R8 = (void *)((long)in_R8 * lVar13);
          if (*(char *)((long)in_R8 + uVar16 + img.img_._16_8_) == '\0') goto LAB_001e5d90;
          if ((uVar16 != 0) &&
             (piVar1 = (int *)(lVar10 + -4 + uVar16 * 4), *piVar1 = *piVar1 + 1,
             *(char *)((uVar16 - 1) + lVar11) != '\0')) {
            lVar12 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar13 * lVar12 + img_labels.accesses_._16_8_ + -4 + uVar16 * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar13 * lVar10 + img_labels.img_._16_8_ + -4 + uVar16 * 4);
            piVar1 = (int *)(lVar12 * uVar17 + img_labels.accesses_._16_8_ + -4 + uVar16 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = UFPC::MemMerge(uVar9,*(uint *)(lVar10 * uVar17 + img_labels.img_._16_8_ + -4 +
                                                  uVar16 * 4));
            goto LAB_001e5de2;
          }
          lVar12 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar13 * lVar12 + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar1 = *piVar1 + 1;
          lVar10 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(lVar13 * lVar10 + img_labels.img_._16_8_ + uVar16 * 4);
          piVar1 = (int *)(lVar12 * uVar17 + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar1 = *piVar1 + 1;
          lVar12 = lVar10 * uVar17 + img_labels.img_._16_8_;
        }
        *(uint *)(lVar12 + uVar16 * 4) = uVar9;
      }
    }
    uVar17 = uVar17 + 1;
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY); // Equivalence solver

        // Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemSetup();

        // First scan

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {

#define CONDITION_Q r > 0 && img(r - 1, c)>0
#define CONDITION_S c > 0 && img(r,c - 1)>0
#define CONDITION_X img(r,c)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c); // x <- q
#define ACTION_4 img_labels(r, c) = img_labels(r, c - 1); // x <- s
#define ACTION_5 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r - 1, c - 1), (unsigned)img_labels(r, c - 1)); // x <- p + s


#include "labeling_sauf_4c_tree.inc.h"             
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::MemFlatten();

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
                img_labels(r, c) = LabelsSolver::MemGetLabel(img_labels(r, c));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }